

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O0

LY_ERR lys_compile_depset_all(ly_ctx *ctx,lys_glob_unres *unres)

{
  LY_ERR LVar1;
  LY_ERR ret___1;
  LY_ERR ret__;
  uint32_t i;
  lys_glob_unres *unres_local;
  ly_ctx *ctx_local;
  
  ret___1 = LY_SUCCESS;
  while( true ) {
    if ((unres->dep_sets).count <= ret___1) {
      return LY_SUCCESS;
    }
    LVar1 = lys_compile_depset_check_features((ly_set *)(unres->dep_sets).field_2.dnodes[ret___1]);
    if (LVar1 != LY_SUCCESS) break;
    LVar1 = lys_compile_depset_r(ctx,(ly_set *)(unres->dep_sets).field_2.dnodes[ret___1],unres);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    ret___1 = ret___1 + LY_EMEM;
  }
  return LVar1;
}

Assistant:

LY_ERR
lys_compile_depset_all(struct ly_ctx *ctx, struct lys_glob_unres *unres)
{
    uint32_t i;

    for (i = 0; i < unres->dep_sets.count; ++i) {
        LY_CHECK_RET(lys_compile_depset_check_features(unres->dep_sets.objs[i]));
        LY_CHECK_RET(lys_compile_depset_r(ctx, unres->dep_sets.objs[i], unres));
    }

    return LY_SUCCESS;
}